

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Token * attribute_list(C_Parser *parser,C_Token *tok,C_Type *ty)

{
  bool bVar1;
  _Bool _Var2;
  int64_t iVar3;
  _Bool first;
  C_Type *ty_local;
  C_Token *tok_local;
  C_Parser *parser_local;
  
  ty_local = (C_Type *)tok;
  tok_local = (C_Token *)parser;
  do {
    _Var2 = C_consume((C_Token **)&ty_local,(C_Token *)ty_local,"__attribute__");
    if (!_Var2) {
      return (C_Token *)ty_local;
    }
    ty_local = (C_Type *)C_skip((C_Parser *)tok_local,(C_Token *)ty_local,"(");
    ty_local = (C_Type *)C_skip((C_Parser *)tok_local,(C_Token *)ty_local,"(");
    bVar1 = true;
    while( true ) {
      _Var2 = C_consume((C_Token **)&ty_local,(C_Token *)ty_local,")");
      if (((_Var2 ^ 0xffU) & 1) == 0) break;
      if (!bVar1) {
        ty_local = (C_Type *)C_skip((C_Parser *)tok_local,(C_Token *)ty_local,",");
      }
      bVar1 = false;
      _Var2 = C_consume((C_Token **)&ty_local,(C_Token *)ty_local,"packed");
      if (_Var2) {
        ty->is_packed = true;
      }
      else {
        _Var2 = C_consume((C_Token **)&ty_local,(C_Token *)ty_local,"aligned");
        if (!_Var2) {
          C_error_tok((C_Parser *)tok_local,(C_Token *)ty_local,"unknown attribute");
        }
        ty_local = (C_Type *)C_skip((C_Parser *)tok_local,(C_Token *)ty_local,"(");
        iVar3 = C_const_expr((C_Parser *)tok_local,(C_Token **)&ty_local,(C_Token *)ty_local);
        ty->align = (int)iVar3;
        ty_local = (C_Type *)C_skip((C_Parser *)tok_local,(C_Token *)ty_local,")");
      }
    }
    ty_local = (C_Type *)C_skip((C_Parser *)tok_local,(C_Token *)ty_local,")");
  } while( true );
}

Assistant:

static C_Token *attribute_list(C_Parser *parser, C_Token *tok, C_Type *ty) {
  while (C_consume(&tok, tok, "__attribute__")) {
    tok = C_skip(parser, tok, "(");
    tok = C_skip(parser, tok, "(");

    bool first = true;

    while (!C_consume(&tok, tok, ")")) {
      if (!first)
        tok = C_skip(parser, tok, ",");
      first = false;

      if (C_consume(&tok, tok, "packed")) {
        ty->is_packed = true;
        continue;
      }

      if (C_consume(&tok, tok, "aligned")) {
        tok = C_skip(parser, tok, "(");
        ty->align = C_const_expr(parser, &tok, tok);
        tok = C_skip(parser, tok, ")");
        continue;
      }

      C_error_tok(parser, tok, "unknown attribute");
    }

    tok = C_skip(parser, tok, ")");
  }

  return tok;
}